

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O1

CodePrinter * __thiscall choc::text::CodePrinter::operator<<(CodePrinter *this,uint v)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  string __str;
  string local_40;
  
  cVar4 = '\x01';
  if (9 < v) {
    uVar2 = v;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar2 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00240a3b;
      }
      if (uVar2 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00240a3b;
      }
      if (uVar2 < 10000) goto LAB_00240a3b;
      bVar1 = 99999 < uVar2;
      uVar2 = uVar2 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00240a3b:
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_40._M_dataplus._M_p,(uint)local_40._M_string_length,v);
  append(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

CodePrinter& CodePrinter::operator<< (IntegerType v)
{
    static_assert (std::is_integral<IntegerType>::value, "You're probably trying to write a type that's not supported");
    append (std::to_string (v));
    return *this;
}